

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O0

future<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_>
__thiscall
thread_pool::ThreadPool::
Submit<ram::MinimizerEngine::Minimize(__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,bool)::__0,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>&>
          (ThreadPool *this,anon_class_16_2_0d9e110d_for__M_f *routine,
          __normal_iterator<const_std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_*,_std::vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>_>
          *params)

{
  bool bVar1;
  bool bVar2;
  __int_type_conflict _Var3;
  size_type sVar4;
  reference pvVar5;
  __normal_iterator<const_std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_*,_std::vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>_>
  *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  future<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_>
  fVar6;
  long local_90;
  size_t i;
  bool is_submitted;
  __int_type_conflict task_id;
  anon_class_16_1_8991e283 task_wrapper;
  type local_50;
  shared_ptr<std::packaged_task<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_()>_>
  task;
  __normal_iterator<const_std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_*,_std::vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>_>
  *params_local;
  anon_class_16_2_0d9e110d_for__M_f *routine_local;
  ThreadPool *this_local;
  future<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_>
  *task_result;
  
  std::
  bind<ram::MinimizerEngine::Minimize(__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,bool)::__0,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>&>
            (&local_50,(anon_class_16_2_0d9e110d_for__M_f *)params,in_RCX);
  std::
  make_shared<std::packaged_task<std::vector<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>()>,std::_Bind<ram::MinimizerEngine::Minimize(__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,bool)::__0(__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>)>>
            ((_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_lbcb_sci[P]ram_src_minimizer_engine_cpp:69:13)_(__gnu_cxx::__normal_iterator<const_std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_*,_std::vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>_>)>
              *)&stack0xffffffffffffffc8);
  std::
  __shared_ptr_access<std::packaged_task<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_()>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::packaged_task<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_()>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&stack0xffffffffffffffc8);
  std::
  packaged_task<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_()>
  ::get_future((packaged_task<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_()>
                *)this);
  std::
  shared_ptr<std::packaged_task<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_()>_>
  ::shared_ptr((shared_ptr<std::packaged_task<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_()>_>
                *)&task_id,
               (shared_ptr<std::packaged_task<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_()>_>
                *)&stack0xffffffffffffffc8);
  _Var3 = std::__atomic_base<unsigned_long>::operator++
                    ((__atomic_base<unsigned_long> *)&routine[6].minhash,0);
  bVar1 = false;
  local_90 = 0;
  do {
    sVar4 = std::
            vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
            ::size((vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                    *)(routine + 5));
    if (local_90 == sVar4 * 0x2a) {
LAB_0011c79e:
      if (!bVar1) {
        sVar4 = std::
                vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                ::size((vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                        *)(routine + 5));
        pvVar5 = std::
                 vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                 ::operator[]((vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                               *)(routine + 5),_Var3 % sVar4);
        TaskQueue::
        Push<thread_pool::ThreadPool::Submit<ram::MinimizerEngine::Minimize(__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,bool)::__0,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>&>(ram::MinimizerEngine::Minimize(__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,bool)::__0&&,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>&)::_lambda()_1_&>
                  (pvVar5,(anon_class_16_1_8991e283 *)&task_id);
      }
      Submit<ram::MinimizerEngine::Minimize(__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,bool)::$_0,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>&>(ram::MinimizerEngine::Minimize(__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,bool)::$_0&&,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>&)
      ::{lambda()#1}::~future((_lambda___1_ *)&task_id);
      std::
      shared_ptr<std::packaged_task<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_()>_>
      ::~shared_ptr((shared_ptr<std::packaged_task<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_()>_>
                     *)&stack0xffffffffffffffc8);
      fVar6.
      super___basic_future<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_>
      ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = extraout_RDX._M_pi;
      fVar6.
      super___basic_future<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_>
      ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      return (future<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_>
              )fVar6.
               super___basic_future<std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_>
               ._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
    }
    sVar4 = std::
            vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
            ::size((vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                    *)(routine + 5));
    pvVar5 = std::
             vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
             ::operator[]((vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                           *)(routine + 5),(_Var3 + local_90) % sVar4);
    bVar2 = TaskQueue::
            TryPush<thread_pool::ThreadPool::Submit<ram::MinimizerEngine::Minimize(__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,bool)::__0,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>&>(ram::MinimizerEngine::Minimize(__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>,bool)::__0&&,__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>&)::_lambda()_1_&>
                      (pvVar5,(anon_class_16_1_8991e283 *)&task_id);
    if (bVar2) {
      bVar1 = true;
      goto LAB_0011c79e;
    }
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

auto Submit(T&& routine, Ts&&... params)
      -> std::future<typename std::result_of<T(Ts...)>::type> {
    auto task = std::make_shared<std::packaged_task<typename std::result_of<T(Ts...)>::type()>>(  // NOLINT
        std::bind(std::forward<T>(routine), std::forward<Ts>(params)...));
    auto task_result = task->get_future();
    auto task_wrapper = [task] () {
      (*task)();
    };

    auto task_id = task_id_++;
    bool is_submitted = false;
    for (std::size_t i = 0; i != queues_.size() * 42; ++i) {
      if (queues_[(task_id + i) % queues_.size()].TryPush(task_wrapper)) {
        is_submitted = true;
        break;
      }
    }
    if (!is_submitted) {
      queues_[task_id % queues_.size()].Push(task_wrapper);
    }

    return task_result;
  }